

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

void __thiscall
Indexing::CodeTree::optimizeMemoryAfterRemoval
          (CodeTree *this,Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks,CodeOp *removedOp)

{
  bool bVar1;
  CodeOp **ppCVar2;
  CodeBlock *pCVar3;
  size_t sVar4;
  SearchStruct *pSVar5;
  reference ppCVar6;
  SearchStruct *in_RDX;
  Stack<Indexing::CodeTree::CodeOp_*> *in_RSI;
  long in_RDI;
  CodeOp *prevOp;
  CodeOp *prevAfterLastOp;
  CodeOp *pointingOp;
  CodeBlock *pcb;
  size_t i_1;
  CodeOp **tgtPtr;
  SearchStruct *ss;
  CodeOp *prevFirstOp;
  size_t i;
  size_t cbLen;
  CodeOp firstOpCopy;
  CodeBlock *cb;
  CodeOp *alt;
  CodeOp *firstOp;
  CodeOp *op;
  SearchStruct *in_stack_ffffffffffffff38;
  SearchStruct *in_stack_ffffffffffffff40;
  CodeOp ***in_stack_ffffffffffffff48;
  ILStruct *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  byte bVar7;
  SearchStruct *local_98;
  ILStruct *in_stack_ffffffffffffff70;
  SearchStruct *local_78;
  undefined8 *local_70;
  SearchStruct *local_60;
  ulong local_58;
  CodeOp *local_30;
  SearchStruct *local_28;
  SearchStruct *local_20;
  
  local_28 = (SearchStruct *)Lib::Stack<Indexing::CodeTree::CodeOp_*>::pop(in_RSI);
  local_20 = in_RDX;
  while( true ) {
    while( true ) {
      bVar7 = 0;
      if (local_28 < local_20) {
        ppCVar2 = CodeOp::alternative(&local_20->landingOp);
        bVar7 = *ppCVar2 != (CodeOp *)0x0 ^ 0xff;
      }
      if ((bVar7 & 1) == 0) break;
      local_20 = (SearchStruct *)
                 &local_20[-1].targets.
                  super__Vector_base<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (local_20 != local_28) {
      CodeOp::makeFail(&local_20->landingOp);
      return;
    }
    ppCVar2 = CodeOp::alternative(&local_28->landingOp);
    local_30 = *ppCVar2;
    pCVar3 = firstOpToCodeBlock(&local_28->landingOp);
    bVar1 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::isEmpty(in_RSI);
    if (((bVar1) && (local_30 != (CodeOp *)0x0)) &&
       (bVar1 = CodeOp::isSearchStruct((CodeOp *)0x346d41), bVar1)) {
      CodeOp::makeFail(&local_28->landingOp);
      return;
    }
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      sVar4 = Lib::Vector<Indexing::CodeTree::CodeOp>::length(pCVar3);
      for (local_58 = 0; local_58 < sVar4; local_58 = local_58 + 1) {
        Lib::Vector<Indexing::CodeTree::CodeOp>::operator[](pCVar3,local_58);
        bVar1 = CodeOp::isLitEnd((CodeOp *)0x346dc8);
        if (bVar1) {
          Lib::Vector<Indexing::CodeTree::CodeOp>::operator[](pCVar3,local_58);
          in_stack_ffffffffffffff50 = CodeOp::getILS((CodeOp *)0x346de8);
          if (in_stack_ffffffffffffff50 != (ILStruct *)0x0) {
            ILStruct::~ILStruct(in_stack_ffffffffffffff70);
            ILStruct::operator_delete(in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
          }
        }
      }
    }
    Lib::Vector<Indexing::CodeTree::CodeOp>::deallocate
              ((Vector<Indexing::CodeTree::CodeOp> *)in_stack_ffffffffffffff40);
    bVar1 = Lib::Stack<Indexing::CodeTree::CodeOp_*>::isEmpty(in_RSI);
    if (bVar1) break;
    local_60 = (SearchStruct *)Lib::Stack<Indexing::CodeTree::CodeOp_*>::pop(in_RSI);
    bVar1 = CodeOp::isSearchStruct((CodeOp *)0x346e99);
    if (bVar1) {
      ppCVar2 = CodeOp::alternative((CodeOp *)local_60);
      if ((SearchStruct *)*ppCVar2 == local_28) {
        CodeOp::setAlternative((CodeOp *)local_60,local_30);
        return;
      }
      local_28 = CodeOp::getSearchStruct((CodeOp *)local_60);
      SearchStruct::getTargetOpPtr<false>
                ((SearchStruct *)CONCAT17(bVar7,in_stack_ffffffffffffff58),
                 (CodeOp *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      *local_70 = local_30;
      if (local_30 != (CodeOp *)0x0) {
        return;
      }
      local_78 = (SearchStruct *)0x0;
      while (in_stack_ffffffffffffff40 = local_78,
            pSVar5 = (SearchStruct *)SearchStruct::length((SearchStruct *)0x346f37),
            in_stack_ffffffffffffff40 < pSVar5) {
        ppCVar6 = std::
                  vector<Indexing::CodeTree::CodeOp_*,_std::allocator<Indexing::CodeTree::CodeOp_*>_>
                  ::operator[](&local_28->targets,(size_type)local_78);
        if (*ppCVar6 != (value_type)0x0) {
          return;
        }
        local_78 = (SearchStruct *)((long)&(local_78->landingOp)._content + 1);
      }
      ppCVar2 = CodeOp::alternative(&local_28->landingOp);
      local_30 = *ppCVar2;
      SearchStruct::destroy(in_stack_ffffffffffffff40);
      local_60 = (SearchStruct *)Lib::Stack<Indexing::CodeTree::CodeOp_*>::pop(in_RSI);
    }
    pCVar3 = firstOpToCodeBlock(&local_60->landingOp);
    in_stack_ffffffffffffff38 = local_60;
    sVar4 = Lib::Vector<Indexing::CodeTree::CodeOp>::length(pCVar3);
    in_stack_ffffffffffffff70 = (ILStruct *)(&in_stack_ffffffffffffff38->landingOp + sVar4);
    local_98 = local_60;
    while (local_20 = local_98, ppCVar2 = CodeOp::alternative(&local_98->landingOp),
          (SearchStruct *)*ppCVar2 != local_28) {
      local_98 = (SearchStruct *)&local_98->kind;
    }
    CodeOp::setAlternative(&local_98->landingOp,local_30);
    bVar1 = CodeOp::isSuccess(&in_stack_ffffffffffffff40->landingOp);
    if (bVar1) {
      return;
    }
    while (local_98 = (SearchStruct *)&local_98->kind,
          (ILStruct *)local_98 != in_stack_ffffffffffffff70) {
      ppCVar2 = CodeOp::alternative((CodeOp *)local_98);
      if (*ppCVar2 != (CodeOp *)0x0) {
        return;
      }
      bVar1 = CodeOp::isSuccess(&in_stack_ffffffffffffff40->landingOp);
      if (bVar1) {
        return;
      }
    }
    local_28 = local_60;
  }
  if (local_30 == (CodeOp *)0x0) {
    pCVar3 = (CodeBlock *)0x0;
  }
  else {
    pCVar3 = firstOpToCodeBlock(local_30);
  }
  *(CodeBlock **)(in_RDI + 0x18) = pCVar3;
  return;
}

Assistant:

void CodeTree::optimizeMemoryAfterRemoval(Stack<CodeOp*>* firstsInBlocks, CodeOp* removedOp)
{
  ASS(removedOp->isFail());
  LOG_OP("Code tree removal memory optimization");
  LOG_OP("firstsInBlocks->size()="<<firstsInBlocks->size());

  //now let us remove unnecessary instructions and the free memory

  CodeOp* op=removedOp;
  ASS(firstsInBlocks->isNonEmpty());
  CodeOp* firstOp=firstsInBlocks->pop();
  for(;;) {
    //firstOp is in a CodeBlock
    ASS(!firstOp->isSearchStruct());
    //op is in the CodeBlock starting at firstOp
    ASS_LE(firstOp, op);
    ASS_G(firstOp+firstOpToCodeBlock(firstOp)->length(), op);

    while(op>firstOp && !op->alternative()) { ASS(!op->isSuccess()); op--; }

    ASS(!op->isSuccess());

    if(op!=firstOp) {
      ASS(op->alternative());
      //we only change the instruction, the alternative must remain unchanged
      op->makeFail();
      return;
    }
    CodeOp* alt=firstOp->alternative();

    CodeBlock* cb=firstOpToCodeBlock(firstOp);

    if(firstsInBlocks->isEmpty() && alt && alt->isSearchStruct()) {
      //We should remove the CodeBlock referenced by _entryPoint, but
      //we cannot replace it by its alternative as it is not a CodeBlock
      //(it's a SearchStruct). Therefore w will not delete it, just set
      //the first operation to fail.
      ASS_EQ(cb,_entryPoint);
      firstOp->makeFail();
      return;
    }

    CodeOp firstOpCopy= *firstOp;

    if(_clauseCodeTree) {
      //delete ILStruct objects
      size_t cbLen=cb->length();
      for(size_t i=0;i<cbLen;i++) {
	if((*cb)[i].isLitEnd()) {
	  delete (*cb)[i].getILS();
	}
      }
    }
    cb->deallocate(); //from now on we mustn't dereference firstOp

    if(firstsInBlocks->isEmpty()) {
      ASS(!alt || !alt->isSearchStruct());
      ASS_EQ(cb,_entryPoint);
      _entryPoint=alt ? firstOpToCodeBlock(alt) : 0;
      return;
    }

    //first operation in the CodeBlock that points to the current one (i.e. cb)
    CodeOp* prevFirstOp=firstsInBlocks->pop();

    if(prevFirstOp->isSearchStruct()) {
      if(prevFirstOp->alternative()==firstOp) {
	//firstOp was an alternative to the SearchStruct
	prevFirstOp->setAlternative(alt);
	return;
      }
      auto ss = prevFirstOp->getSearchStruct();
      CodeOp** tgtPtr;
      ALWAYS(ss->getTargetOpPtr<false>(firstOpCopy, tgtPtr));
      ASS_EQ(*tgtPtr, firstOp);
      *tgtPtr=alt;
      if(alt) {
	ASS( (ss->kind==SearchStruct::FN_STRUCT && alt->isCheckFun()) ||
	    (ss->kind==SearchStruct::GROUND_TERM_STRUCT && alt->isCheckGroundTerm()) );
	return;
      }
      for(size_t i=0; i<ss->length(); i++) {
	if(ss->targets[i]!=0) {
	  //the SearchStruct still contains something, so we won't delete it
	  //TODO: we might want to compress the SearchStruct, if there are too many zeroes
	  return;
	}
      }

      //if we're at this point, the SEARCH_STRUCT will be deleted
      firstOp=&ss->landingOp;
      alt=ss->landingOp.alternative();
      ss->destroy();

      //now let's continue as if there wasn't any SEARCH_STRUCT operation:)

      //the SEARCH_STRUCT is never the first operation in the CodeTree
      ASS(firstsInBlocks->isNonEmpty());
      prevFirstOp=firstsInBlocks->pop();
      //there never are two nested SEARCH_STRUCT operations
      ASS(!prevFirstOp->isSearchStruct());
    }

    CodeBlock* pcb=firstOpToCodeBlock(prevFirstOp);

    //operation that points to the current CodeBlock
    CodeOp* pointingOp=0;

    CodeOp* prevAfterLastOp=prevFirstOp+pcb->length();
    CodeOp* prevOp=prevFirstOp;
    while(prevOp->alternative()!=firstOp) {
      ASS_L(prevOp,prevAfterLastOp);
      prevOp++;
    }
    pointingOp=prevOp;

    pointingOp->setAlternative(alt);
    if(pointingOp->isSuccess()) {
      return;
    }

    prevOp++;
    while(prevOp!=prevAfterLastOp) {
      ASS_NEQ(prevOp->alternative(),firstOp);

      if(prevOp->alternative() || prevOp->isSuccess()) {
	//there is an operation after the pointingOp that cannot be lost
	return;
      }
      prevOp++;
    }

    firstOp=prevFirstOp;
    op=pointingOp;
  }
}